

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffers_iterator.hpp
# Opt level: O0

void __thiscall
asio::buffers_iterator<asio::const_buffers_1,_char>::buffers_iterator
          (buffers_iterator<asio::const_buffers_1,_char> *this)

{
  buffers_iterator<asio::const_buffers_1,_char> *this_local;
  
  const_buffer::const_buffer(&this->current_buffer_);
  this->current_buffer_position_ = 0;
  this->begin_ = (buffer_sequence_iterator_type)0x0;
  this->current_ = (buffer_sequence_iterator_type)0x0;
  this->end_ = (buffer_sequence_iterator_type)0x0;
  this->position_ = 0;
  return;
}

Assistant:

buffers_iterator()
    : current_buffer_(),
      current_buffer_position_(0),
      begin_(),
      current_(),
      end_(),
      position_(0)
  {
  }